

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.cc
# Opt level: O0

void __thiscall tcmalloc::PageHeap::MergeIntoFreeList(PageHeap *this,Span *span)

{
  PageID PVar1;
  Length LVar2;
  Length LVar3;
  bool bVar4;
  ulong uVar5;
  Span *pSVar6;
  Length len_1;
  Span *next;
  Length len;
  Span *prev;
  Length n;
  PageID p;
  Span *span_local;
  PageHeap *this_local;
  Number i2;
  Number i1;
  Span *local_38;
  Number i2_1;
  Number i1_1;
  Span *local_10;
  
  PVar1 = span->start;
  LVar2 = span->length;
  if ((((this->aggressive_decommit_ & 1U) != 0) && ((*(uint *)&span->field_0x28 >> 0x18 & 3) == 1))
     && (bVar4 = DecommitSpan(this,span), bVar4)) {
    *(uint *)&span->field_0x28 = *(uint *)&span->field_0x28 & 0xfcffffff | 0x2000000;
  }
  uVar5 = PVar1 - 1;
  if ((uVar5 >> 0x23 == 0) && ((this->pagemap_).root_[uVar5 >> 0x12] != (Leaf *)0x0)) {
    local_38 = (Span *)(this->pagemap_).root_[uVar5 >> 0x12]->values[uVar5 & 0x3ffff];
  }
  else {
    local_38 = (Span *)0x0;
  }
  pSVar6 = CheckAndHandlePreMerge(this,span,local_38);
  if (pSVar6 != (Span *)0x0) {
    LVar3 = pSVar6->length;
    DeleteSpan(pSVar6);
    span->start = span->start - LVar3;
    span->length = LVar3 + span->length;
    TCMalloc_PageMap2<35>::set(&this->pagemap_,span->start,span);
  }
  uVar5 = PVar1 + LVar2;
  if ((uVar5 >> 0x23 == 0) && ((this->pagemap_).root_[uVar5 >> 0x12] != (Leaf *)0x0)) {
    local_10 = (Span *)(this->pagemap_).root_[uVar5 >> 0x12]->values[uVar5 & 0x3ffff];
  }
  else {
    local_10 = (Span *)0x0;
  }
  pSVar6 = CheckAndHandlePreMerge(this,span,local_10);
  if (pSVar6 != (Span *)0x0) {
    LVar2 = pSVar6->length;
    DeleteSpan(pSVar6);
    span->length = LVar2 + span->length;
    TCMalloc_PageMap2<35>::set(&this->pagemap_,(span->start + span->length) - 1,span);
  }
  PrependToFreeList(this,span);
  return;
}

Assistant:

void PageHeap::MergeIntoFreeList(Span* span) {
  ASSERT(lock_.IsHeld());
  ASSERT(span->location != Span::IN_USE);

  // Coalesce -- we guarantee that "p" != 0, so no bounds checking
  // necessary.  We do not bother resetting the stale pagemap
  // entries for the pieces we are merging together because we only
  // care about the pagemap entries for the boundaries.
  //
  // Note: depending on aggressive_decommit_ mode we allow only
  // similar spans to be coalesced.
  //
  // The following applies if aggressive_decommit_ is enabled:
  //
  // TODO(jar): "Always decommit" causes some extra calls to commit when we are
  // called in GrowHeap() during an allocation :-/.  We need to eval the cost of
  // that oscillation, and possibly do something to reduce it.

  // TODO(jar): We need a better strategy for deciding to commit, or decommit,
  // based on memory usage and free heap sizes.

  const PageID p = span->start;
  const Length n = span->length;

  if (aggressive_decommit_ && span->location == Span::ON_NORMAL_FREELIST) {
    if (DecommitSpan(span)) {
      span->location = Span::ON_RETURNED_FREELIST;
    }
  }

  Span* prev = CheckAndHandlePreMerge(span, GetDescriptor(p-1));
  if (prev != nullptr) {
    // Merge preceding span into this span
    ASSERT(prev->start + prev->length == p);
    const Length len = prev->length;
    DeleteSpan(prev);
    span->start -= len;
    span->length += len;
    pagemap_.set(span->start, span);
  }
  Span* next = CheckAndHandlePreMerge(span, GetDescriptor(p+n));
  if (next != nullptr) {
    // Merge next span into this span
    ASSERT(next->start == p+n);
    const Length len = next->length;
    DeleteSpan(next);
    span->length += len;
    pagemap_.set(span->start + span->length - 1, span);
  }

  PrependToFreeList(span);
}